

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs_conv.c
# Opt level: O2

void FFSconvert_record(IOConversionPtr conv,void *src,void *dest,void *final_string_base,
                      void *src_string_base)

{
  uint uVar1;
  uint *puVar2;
  ulong uVar3;
  void *pvVar4;
  ulong uVar5;
  run_time_conv_status rtcs;
  
  pvVar4 = src_string_base;
  if (src_string_base == (void *)0x0) {
    pvVar4 = final_string_base;
  }
  if (conv->conv_func == (conv_routine)0x0) {
    rtcs.dest_offset_adjust = (ssize_t)pvVar4;
    internal_convert_record(conv,(ConvStatus)&rtcs,src,dest,(int)src_string_base);
  }
  else {
    if (_debug_code_generation != 0) {
      printf("record of type \"%s\", contents :\n",conv->ioformat->body->format_name);
      uVar1 = conv->ioformat->body->record_length;
      uVar3 = 0x1e;
      if (uVar1 < 0x78) {
        uVar3 = (ulong)(uVar1 >> 2);
      }
      puVar2 = (uint *)src;
      for (uVar5 = 0; uVar5 < uVar3; uVar5 = uVar5 + 4) {
        printf("%p: %8x %8x %8x %8x\n",puVar2,(ulong)*puVar2,(ulong)puVar2[1],(ulong)puVar2[2],
               (ulong)puVar2[3]);
        puVar2 = puVar2 + 4;
      }
      if (pvVar4 != (void *)0x0) {
        puVar2 = (uint *)((long)pvVar4 - (long)pvVar4 % 4);
        puts("string contents :");
        for (uVar3 = 0; uVar3 < 10; uVar3 = uVar3 + 4) {
          printf("%p: %8x %8x %8x %8x\n",puVar2,(ulong)*puVar2,(ulong)puVar2[1],(ulong)puVar2[2],
                 (ulong)puVar2[3]);
          puVar2 = puVar2 + 4;
        }
      }
    }
    rtcs.dest_offset_adjust = -conv->string_offset_size;
    rtcs.src_pointer_base = pvVar4;
    rtcs.dest_pointer_base = final_string_base;
    (*conv->conv_func)(src,dest,&rtcs);
  }
  return;
}

Assistant:

void
FFSconvert_record(IOConversionPtr conv, void *src, void *dest, void *final_string_base, void *src_string_base)
{
    struct conv_status cs;
    if (src_string_base == NULL) {
	src_string_base = final_string_base;
    }
    if (conv->conv_func) {
	struct run_time_conv_status rtcs;
	if (debug_code_generation()) {
	    int i;
	    int limit = 30;
	    int *tmp = (int *) (((char *) src_string_base) -
				(((intptr_t) src_string_base) % 4));
	    printf("record of type \"%s\", contents :\n", 
		   conv->ioformat->body->format_name);
	    if (limit * sizeof(int) > conv->ioformat->body->record_length)
		limit = conv->ioformat->body->record_length / sizeof(int);
	    for (i = 0; i < limit; i += 4) {
		printf("%p: %8x %8x %8x %8x\n", ((char *) src) + (i * 4),
		       ((int *) src)[i], ((int *) src)[i + 1],
		       ((int *) src)[i + 2], ((int *) src)[i + 3]);
	    }
	    if (src_string_base != NULL) {
		printf("string contents :\n");
		limit = 10;
/*		if (conv->ioformat->body->variant) {
		    FILE_INT record_len;
		    int len_align_pad = (4 - conv->ioformat->body->server_ID.length) & 3;
		    FILE_INT *len_ptr = (FILE_INT *) (src + conv->ioformat->body->server_ID.length +
						      len_align_pad);
		    memcpy(&record_len, len_ptr, sizeof(FILE_INT));
		    if (conv->ioformat->body->byte_reversal)
			byte_swap((char *) &record_len, 4);
		    record_len -= conv->ioformat->body->record_length;
		    if (limit * sizeof(int) > record_len) {
			limit = record_len / sizeof(int);
		    }
		}
*/		for (i = 0; i < limit; i += 4) {
		    printf("%p: %8x %8x %8x %8x\n", ((char *) tmp) + (i * 4),
			   ((int *) tmp)[i],
			   ((int *) tmp)[i + 1],
			   ((int *) tmp)[i + 2],
			   ((int *) tmp)[i + 3]);
		}
	    }
	}
	rtcs.src_pointer_base = src_string_base;
	rtcs.dest_pointer_base = final_string_base;
	rtcs.dest_offset_adjust = -(ssize_t) conv->string_offset_size;
	conv->conv_func(src, dest, &rtcs);
	return;
    } else {
	cs.src_pointer_base = src_string_base;
	cs.dest_pointer_base = final_string_base;
	cs.src_offset_adjust = -(ssize_t)conv->string_offset_size;
	cs.dest_offset_adjust = -(ssize_t)conv->string_offset_size;
	cs.cur_offset = 0;
	cs.control_value = NULL;
	cs.target_pointer_size = conv->target_pointer_size;
	cs.src_pointer_size = conv->ioformat->body->pointer_size;
	cs.global_conv = conv;
	internal_convert_record(conv, &cs, src, dest, 1);
    }
}